

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O2

Color __thiscall nite::Color::operator/(Color *this,float c)

{
  Color *in_RSI;
  undefined8 extraout_XMM0_Qa;
  float fVar1;
  Color CVar3;
  ulong uVar2;
  
  Color(this,in_RSI);
  this->r = this->r / c;
  fVar1 = this->g / c;
  uVar2 = (ulong)(uint)fVar1;
  this->g = fVar1;
  this->b = this->b / c;
  rectify(this);
  CVar3.b = (float)(int)uVar2;
  CVar3.a = (float)(int)(uVar2 >> 0x20);
  CVar3.r = (float)(int)extraout_XMM0_Qa;
  CVar3.g = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return CVar3;
}

Assistant:

nite::Color nite::Color::operator/(float c){
	auto b = *this;
	b.r /= c;
	b.g /= c;
	b.b /= c;
	b.rectify();
	return b;
}